

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O2

Debugger * Debugger::GetDebugger(JsRuntimeHandle runtime)

{
  if (debugger == (Debugger *)0x0) {
    debugger = (Debugger *)operator_new(0x18);
    debugger->m_runtime = runtime;
    debugger->m_context = (JsContextRef)0x0;
    debugger->m_isDetached = true;
    Initialize(debugger);
  }
  return debugger;
}

Assistant:

Debugger * Debugger::GetDebugger(JsRuntimeHandle runtime)
{
    if (Debugger::debugger == nullptr)
    {
        Debugger::debugger = new Debugger(runtime);
        Debugger::debugger->Initialize();
    }

    return Debugger::debugger;
}